

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

NodeRef * __thiscall
c4::yml::Tree::operator[](NodeRef *__return_storage_ptr__,Tree *this,csubstr key)

{
  code *pcVar1;
  Location LVar2;
  bool bVar3;
  size_t sVar4;
  NodeRef *pNVar5;
  size_t sVar6;
  size_t sVar7;
  long lVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  byte bVar12;
  char msg [68];
  csubstr local_88;
  char local_78 [64];
  undefined4 local_38;
  
  sVar7 = key.len;
  pcVar10 = key.str;
  bVar12 = 0;
  sVar4 = root_id(this);
  local_88.str = pcVar10;
  local_88.len = sVar7;
  if (sVar4 == 0xffffffffffffffff) {
    pcVar9 = "check failed: (((ConstImpl const* __restrict__)this)->m_id != NONE)";
    pcVar11 = local_78;
    for (lVar8 = 8; lVar8 != 0; lVar8 = lVar8 + -1) {
      *(undefined8 *)pcVar11 = *(undefined8 *)pcVar9;
      pcVar9 = pcVar9 + ((ulong)bVar12 * -2 + 1) * 8;
      pcVar11 = pcVar11 + ((ulong)bVar12 * -2 + 1) * 8;
    }
    local_38 = 0x29454e;
    if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      pcVar1 = (code *)swi(3);
      pNVar5 = (NodeRef *)(*pcVar1)();
      return pNVar5;
    }
    LVar2.super_LineCol.col = 0;
    LVar2.super_LineCol.offset = SUB168(ZEXT816(0x50b2) << 0x40,0);
    LVar2.super_LineCol.line = SUB168(ZEXT816(0x50b2) << 0x40,8);
    LVar2.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar2.name.len = 0x65;
    (*(this->m_callbacks).m_error)(local_78,0x44,LVar2,(this->m_callbacks).m_user_data);
  }
  sVar6 = find_child(this,sVar4,&local_88);
  pcVar9 = (char *)0x0;
  bVar3 = sVar6 == 0xffffffffffffffff;
  if (bVar3) {
    pcVar9 = pcVar10;
    sVar6 = sVar4;
  }
  sVar4 = 0xffffffffffffffff;
  if (bVar3) {
    sVar4 = sVar7;
  }
  __return_storage_ptr__->m_tree = this;
  __return_storage_ptr__->m_id = sVar6;
  (__return_storage_ptr__->m_seed).str = pcVar9;
  (__return_storage_ptr__->m_seed).len = sVar4;
  return __return_storage_ptr__;
}

Assistant:

NodeRef Tree::operator[] (csubstr key)
{
    return rootref()[key];
}